

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O2

int __thiscall rr::TriangleRasterizer::init(TriangleRasterizer *this,EVP_PKEY_CTX *ctx)

{
  EdgeFunction *edge;
  int iVar1;
  undefined8 uVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  float *in_RCX;
  long lVar6;
  bool bVar7;
  VerticalFill VVar8;
  int iVar9;
  float *in_RDX;
  ulong uVar10;
  long lVar11;
  HorizontalFill HVar12;
  ulong uVar13;
  EdgeFunction *edge_00;
  int iVar14;
  long y0;
  long x1;
  int iVar15;
  long y1;
  int iVar16;
  long lVar17;
  long lVar18;
  long x1_00;
  uint uVar19;
  long y1_00;
  
  uVar2 = *(undefined8 *)(ctx + 8);
  *(undefined8 *)(this->m_v0).m_data = *(undefined8 *)ctx;
  *(undefined8 *)((this->m_v0).m_data + 2) = uVar2;
  uVar2 = *(undefined8 *)(in_RDX + 2);
  *(undefined8 *)(this->m_v1).m_data = *(undefined8 *)in_RDX;
  *(undefined8 *)((this->m_v1).m_data + 2) = uVar2;
  uVar2 = *(undefined8 *)(in_RCX + 2);
  *(undefined8 *)(this->m_v2).m_data = *(undefined8 *)in_RCX;
  *(undefined8 *)((this->m_v2).m_data + 2) = uVar2;
  uVar19 = -(uint)(*(float *)ctx < 0.0);
  lVar4 = (long)(*(float *)ctx * 256.0 + (float)(~uVar19 & 0x3f000000 | uVar19 & 0xbf000000));
  uVar19 = -(uint)(*(float *)(ctx + 4) < 0.0);
  lVar18 = (long)(*(float *)(ctx + 4) * 256.0 + (float)(~uVar19 & 0x3f000000 | uVar19 & 0xbf000000))
  ;
  uVar19 = -(uint)(*in_RDX < 0.0);
  x1_00 = (long)(*in_RDX * 256.0 + (float)(~uVar19 & 0x3f000000 | uVar19 & 0xbf000000));
  uVar19 = -(uint)(in_RDX[1] < 0.0);
  y1 = (long)(in_RDX[1] * 256.0 + (float)(~uVar19 & 0x3f000000 | uVar19 & 0xbf000000));
  uVar19 = -(uint)(*in_RCX < 0.0);
  lVar11 = (long)(*in_RCX * 256.0 + (float)(~uVar19 & 0x3f000000 | uVar19 & 0xbf000000));
  uVar19 = -(uint)(in_RCX[1] < 0.0);
  lVar17 = (long)(in_RCX[1] * 256.0 + (float)(~uVar19 & 0x3f000000 | uVar19 & 0xbf000000));
  edge_00 = &this->m_edge01;
  edge = &this->m_edge12;
  if (this->m_winding == WINDING_CCW) {
    initEdgeCCW(edge_00,this->m_horizontalFill,this->m_verticalFill,lVar4,lVar18,x1_00,y1);
    initEdgeCCW(edge,this->m_horizontalFill,this->m_verticalFill,x1_00,y1,lVar11,lVar17);
    HVar12 = this->m_horizontalFill;
    VVar8 = this->m_verticalFill;
    lVar6 = lVar11;
    y0 = lVar17;
    x1 = lVar4;
    y1_00 = lVar18;
  }
  else {
    initEdgeCCW(edge_00,this->m_horizontalFill,this->m_verticalFill,x1_00,y1,lVar4,lVar18);
    initEdgeCCW(edge,this->m_horizontalFill,this->m_verticalFill,lVar11,lVar17,x1_00,y1);
    HVar12 = this->m_horizontalFill;
    VVar8 = this->m_verticalFill;
    lVar6 = lVar4;
    y0 = lVar18;
    x1 = lVar11;
    y1_00 = lVar17;
  }
  initEdgeCCW(&this->m_edge20,HVar12,VVar8,lVar6,y0,x1,y1_00);
  lVar6 = (this->m_edge01).b * lVar17 + (this->m_edge01).a * lVar11 + (this->m_edge01).c;
  bVar7 = lVar6 < 0;
  if (this->m_winding == WINDING_CCW) {
    bVar7 = 0 < lVar6;
  }
  this->m_face = (uint)(byte)(this->m_viewportOrientation != VIEWPORTORIENTATION_UPPER_LEFT ^ bVar7)
  ;
  if (bVar7 == false) {
    reverseEdge(edge_00);
    reverseEdge(edge);
    reverseEdge(&this->m_edge20);
  }
  lVar6 = x1_00;
  if (lVar4 < x1_00) {
    lVar6 = lVar4;
  }
  if (x1_00 < lVar4) {
    x1_00 = lVar4;
  }
  if (lVar11 <= lVar6) {
    lVar6 = lVar11;
  }
  if (x1_00 <= lVar11) {
    x1_00 = lVar11;
  }
  lVar4 = y1;
  if (lVar18 < y1) {
    lVar4 = lVar18;
  }
  if (y1 < lVar18) {
    y1 = lVar18;
  }
  if (lVar17 <= lVar4) {
    lVar4 = lVar17;
  }
  if (y1 <= lVar17) {
    y1 = lVar17;
  }
  HVar12 = this->m_horizontalFill;
  lVar11 = 0xffffffff01;
  lVar17 = lVar11;
  if (HVar12 == FILL_LEFT) {
    lVar17 = 0xffffffff00;
  }
  lVar18 = -(ulong)(HVar12 == FILL_LEFT);
  if (lVar6 < 0) {
    lVar18 = lVar17;
  }
  VVar8 = this->m_verticalFill;
  if (VVar8 == FILL_BOTTOM) {
    lVar11 = 0xffffffff00;
  }
  lVar17 = -(ulong)(VVar8 == FILL_BOTTOM);
  if (lVar4 < 0) {
    lVar17 = lVar11;
  }
  uVar13 = (ulong)(HVar12 == FILL_RIGHT) + 0xff;
  if (x1_00 < 0) {
    uVar13 = (ulong)(HVar12 == FILL_RIGHT);
  }
  uVar10 = (ulong)(VVar8 == FILL_TOP) + 0xff;
  if (y1 < 0) {
    uVar10 = (ulong)(VVar8 == FILL_TOP);
  }
  iVar9 = (this->m_viewport).m_data[0];
  iVar1 = (this->m_viewport).m_data[1];
  iVar14 = (this->m_viewport).m_data[2] + iVar9 + -1;
  iVar3 = (int)((ulong)(lVar18 + lVar6) >> 8);
  iVar16 = iVar14;
  if (iVar3 < iVar14) {
    iVar16 = iVar3;
  }
  iVar15 = (this->m_viewport).m_data[3] + iVar1 + -1;
  if (iVar3 < iVar9) {
    iVar16 = iVar9;
  }
  iVar5 = (int)((ulong)(lVar17 + lVar4) >> 8);
  iVar3 = iVar15;
  if (iVar5 < iVar15) {
    iVar3 = iVar5;
  }
  if (iVar5 < iVar1) {
    iVar3 = iVar1;
  }
  iVar5 = (int)(uVar13 + x1_00 >> 8);
  if (iVar5 < iVar14) {
    iVar14 = iVar5;
  }
  if (iVar5 < iVar9) {
    iVar14 = iVar9;
  }
  (this->m_bboxMin).m_data[0] = iVar16;
  iVar9 = (int)(uVar10 + y1 >> 8);
  if (iVar9 < iVar15) {
    iVar15 = iVar9;
  }
  (this->m_bboxMin).m_data[1] = iVar3;
  if (iVar9 < iVar1) {
    iVar15 = iVar1;
  }
  (this->m_bboxMax).m_data[0] = iVar14;
  (this->m_bboxMax).m_data[1] = iVar15;
  uVar2 = *(undefined8 *)(this->m_bboxMin).m_data;
  *(undefined8 *)(this->m_curPos).m_data = uVar2;
  return (int)uVar2;
}

Assistant:

void TriangleRasterizer::init (const tcu::Vec4& v0, const tcu::Vec4& v1, const tcu::Vec4& v2)
{
	m_v0 = v0;
	m_v1 = v1;
	m_v2 = v2;

	// Positions in fixed-point coordinates.
	const deInt64	x0		= toSubpixelCoord(v0.x());
	const deInt64	y0		= toSubpixelCoord(v0.y());
	const deInt64	x1		= toSubpixelCoord(v1.x());
	const deInt64	y1		= toSubpixelCoord(v1.y());
	const deInt64	x2		= toSubpixelCoord(v2.x());
	const deInt64	y2		= toSubpixelCoord(v2.y());

	// Initialize edge functions.
	if (m_winding == WINDING_CCW)
	{
		initEdgeCCW(m_edge01, m_horizontalFill, m_verticalFill, x0, y0, x1, y1);
		initEdgeCCW(m_edge12, m_horizontalFill, m_verticalFill, x1, y1, x2, y2);
		initEdgeCCW(m_edge20, m_horizontalFill, m_verticalFill, x2, y2, x0, y0);
	}
	else
	{
		// Reverse edges
		initEdgeCCW(m_edge01, m_horizontalFill, m_verticalFill, x1, y1, x0, y0);
		initEdgeCCW(m_edge12, m_horizontalFill, m_verticalFill, x2, y2, x1, y1);
		initEdgeCCW(m_edge20, m_horizontalFill, m_verticalFill, x0, y0, x2, y2);
	}

	// Determine face.
	const deInt64	s				= evaluateEdge(m_edge01, x2, y2);
	const bool		positiveArea	= (m_winding == WINDING_CCW) ? (s > 0) : (s < 0);

	if (m_viewportOrientation == VIEWPORTORIENTATION_UPPER_LEFT)
		m_face = positiveArea ? FACETYPE_BACK : FACETYPE_FRONT;
	else
		m_face = positiveArea ? FACETYPE_FRONT : FACETYPE_BACK;

	if (!positiveArea)
	{
		// Reverse edges so that we can use CCW area tests & interpolation
		reverseEdge(m_edge01);
		reverseEdge(m_edge12);
		reverseEdge(m_edge20);
	}

	// Bounding box
	const deInt64	xMin	= de::min(de::min(x0, x1), x2);
	const deInt64	xMax	= de::max(de::max(x0, x1), x2);
	const deInt64	yMin	= de::min(de::min(y0, y1), y2);
	const deInt64	yMax	= de::max(de::max(y0, y1), y2);

	m_bboxMin.x() = floorSubpixelToPixelCoord	(xMin, m_horizontalFill	== FILL_LEFT);
	m_bboxMin.y() = floorSubpixelToPixelCoord	(yMin, m_verticalFill	== FILL_BOTTOM);
	m_bboxMax.x() = ceilSubpixelToPixelCoord	(xMax, m_horizontalFill	== FILL_RIGHT);
	m_bboxMax.y() = ceilSubpixelToPixelCoord	(yMax, m_verticalFill	== FILL_TOP);

	// Clamp to viewport
	const int		wX0		= m_viewport.x();
	const int		wY0		= m_viewport.y();
	const int		wX1		= wX0 + m_viewport.z() - 1;
	const int		wY1		= wY0 + m_viewport.w() -1;

	m_bboxMin.x() = de::clamp(m_bboxMin.x(), wX0, wX1);
	m_bboxMin.y() = de::clamp(m_bboxMin.y(), wY0, wY1);
	m_bboxMax.x() = de::clamp(m_bboxMax.x(), wX0, wX1);
	m_bboxMax.y() = de::clamp(m_bboxMax.y(), wY0, wY1);

	m_curPos = m_bboxMin;
}